

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CfgData.cpp
# Opt level: O1

void __thiscall CfgData::CfgData(CfgData *this,CFG *cfg)

{
  _Rb_tree_header *p_Var1;
  CfgNode *node;
  Data *pDVar2;
  _Base_ptr p_Var3;
  _Rb_tree_node_base *p_Var4;
  _List_node_base *p_Var5;
  undefined8 *puVar6;
  Addr from;
  Call call;
  Addr local_c0;
  _List_node_base local_b8;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *local_a0;
  _Rb_tree<CfgData::Call,CfgData::Call,std::_Identity<CfgData::Call>,std::less<CfgData::Call>,std::allocator<CfgData::Call>>
  *local_98;
  set<CfgData::Node,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_> *local_90;
  _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
  *local_88;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *local_80;
  Addr local_78;
  Call local_70;
  
  this->_vptr_CfgData = (_func_int **)&PTR__CfgData_00117af8;
  local_80 = &this->m_instrs;
  p_Var1 = &(this->m_instrs)._M_t._M_impl.super__Rb_tree_header;
  (this->m_instrs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_instrs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_instrs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_instrs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_instrs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90 = &this->m_blocks;
  p_Var1 = &(this->m_blocks)._M_t._M_impl.super__Rb_tree_header;
  (this->m_blocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_blocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_blocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_blocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_blocks)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88 = (_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
              *)&this->m_phantoms;
  p_Var1 = &(this->m_phantoms)._M_t._M_impl.super__Rb_tree_header;
  (this->m_phantoms)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_phantoms)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_phantoms)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_phantoms)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_phantoms)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_edges)._M_t._M_impl.super__Rb_tree_header;
  (this->m_edges)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_edges)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_edges)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_edges)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_edges)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98 = (_Rb_tree<CfgData::Call,CfgData::Call,std::_Identity<CfgData::Call>,std::less<CfgData::Call>,std::allocator<CfgData::Call>>
              *)&this->m_calls;
  p_Var1 = &(this->m_calls)._M_t._M_impl.super__Rb_tree_header;
  (this->m_calls)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_calls)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_calls)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_calls)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_calls)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a0 = &this->m_indirects;
  p_Var1 = &(this->m_indirects)._M_t._M_impl.super__Rb_tree_header;
  (this->m_indirects)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_indirects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_indirects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_indirects)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_indirects)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  CFG::nodes_abi_cxx11_((list<CfgNode_*,_std::allocator<CfgNode_*>_> *)&local_b8,cfg);
  if (local_b8._M_next != &local_b8) {
    p_Var5 = local_b8._M_next;
    do {
      node = (CfgNode *)p_Var5[1]._M_next;
      local_78 = CfgNode::node2addr(node);
      if (node->m_type == CFG_PHANTOM) {
        std::
        _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
        ::_M_insert_unique<unsigned_long_const&>(local_88,&local_78);
      }
      else {
        for (p_Var3 = (node->m_succs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var3 != &(node->m_succs)._M_t._M_impl.super__Rb_tree_header;
            p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
          local_70.calls._M_t._M_impl._0_8_ = CfgNode::node2addr((CfgNode *)p_Var3[1]._M_parent);
          local_70._vptr_Call = (_func_int **)&PTR__Edge_00117b28;
          local_70.block_addr = local_78;
          std::
          _Rb_tree<CfgData::Edge,_CfgData::Edge,_std::_Identity<CfgData::Edge>,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>
          ::_M_insert_unique<CfgData::Edge>(&(this->m_edges)._M_t,(Edge *)&local_70);
        }
        if (node->m_type == CFG_BLOCK) {
          pDVar2 = node->m_data;
          if (pDVar2 == (Data *)0x0) {
            __assert_fail("node->data() != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cmpcfgs/src/CfgData.cpp"
                          ,0x2f,"CfgData::CfgData(CFG *)");
          }
          local_70.block_addr = pDVar2->m_addr;
          local_70._vptr_Call = (_func_int **)&PTR__Node_00117b58;
          local_70.calls._M_t._M_impl._4_4_ =
               SUB84((ulong)local_70.calls._M_t._M_impl._0_8_ >> 0x20,0);
          local_70.calls._M_t._M_impl._0_4_ = *(undefined4 *)&pDVar2[1]._vptr_Data;
          std::
          _Rb_tree<CfgData::Node,_CfgData::Node,_std::_Identity<CfgData::Node>,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_>
          ::_M_insert_unique<CfgData::Node>(&local_90->_M_t,(Node *)&local_70);
          for (puVar6 = (undefined8 *)pDVar2[1].m_addr; puVar6 != &pDVar2[1].m_addr;
              puVar6 = (undefined8 *)*puVar6) {
            local_70._vptr_Call = *(_func_int ***)(puVar6[2] + 8);
            std::
            _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
            ::_M_insert_unique<unsigned_long>(&local_80->_M_t,(unsigned_long *)&local_70);
          }
          local_70.block_addr = pDVar2->m_addr;
          local_70._vptr_Call = (_func_int **)&PTR__Call_00117b88;
          local_70.calls._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_70.calls._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_70.calls._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_70.calls._M_t._M_impl.super__Rb_tree_header._M_header;
          local_70.calls._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_70.calls._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               local_70.calls._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          for (p_Var4 = (_Rb_tree_node_base *)pDVar2[4].m_addr;
              p_Var4 != (_Rb_tree_node_base *)&pDVar2[3].m_addr;
              p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
            local_c0 = *(Addr *)(*(long *)(p_Var4 + 1) + 8);
            std::
            _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
            ::_M_insert_unique<unsigned_long>(&local_70.calls._M_t,&local_c0);
          }
          if (local_70.calls._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
            std::
            _Rb_tree<CfgData::Call,CfgData::Call,std::_Identity<CfgData::Call>,std::less<CfgData::Call>,std::allocator<CfgData::Call>>
            ::_M_insert_unique<CfgData::Call_const&>(local_98,&local_70);
          }
          if (*(char *)((long)&pDVar2[1]._vptr_Data + 4) == '\x01') {
            local_c0 = pDVar2->m_addr;
            std::
            _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
            ::_M_insert_unique<unsigned_long>(&local_a0->_M_t,&local_c0);
          }
          local_70._vptr_Call = (_func_int **)&PTR__Call_00117b88;
          std::
          _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
          ::~_Rb_tree(&local_70.calls._M_t);
        }
      }
      p_Var5 = p_Var5->_M_next;
    } while (p_Var5 != &local_b8);
  }
  while (local_b8._M_next != &local_b8) {
    p_Var5 = (((_List_base<CfgNode_*,_std::allocator<CfgNode_*>_> *)&(local_b8._M_next)->_M_next)->
             _M_impl)._M_node.super__List_node_base._M_next;
    operator_delete(local_b8._M_next);
    local_b8._M_next = p_Var5;
  }
  return;
}

Assistant:

CfgData::CfgData(CFG* cfg) {
	for (CfgNode* node : cfg->nodes()) {
		Addr from = CfgNode::node2addr(node);

		if (node->type() == CfgNode::CFG_PHANTOM) {
			m_phantoms.insert(from);
			continue;
		}

		for (CfgNode::Edge edgeSucc : node->successors()) {
			Addr to = CfgNode::node2addr(edgeSucc.node);
			m_edges.insert(CfgData::Edge(from, to));
		}

		if (node->type() != CfgNode::CFG_BLOCK)
			continue;

		assert(node->data() != 0);
		CfgNode::BlockData* block = static_cast<CfgNode::BlockData*>(node->data());
		m_blocks.insert(CfgData::Node(block->addr(), block->size()));

		for (Instruction* instr : block->instructions())
			m_instrs.insert(instr->addr());

		CfgData::Call call(block->addr());
		for (CFG* calledCfg : block->calls()) {
			call.calls.insert(calledCfg->addr());
		}

		if (!call.calls.empty())
			m_calls.insert(call);

		if (block->isIndirect())
			m_indirects.insert(block->addr());
	}
}